

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O0

void __thiscall cppcms::rpc::json_call::return_result(json_call *this,context *c,value *result)

{
  response *out;
  ostream *poVar1;
  value *in_RDI;
  string *in_stack_00000088;
  response *in_stack_00000090;
  response *in_stack_00000108;
  allocator local_39;
  string local_38 [56];
  
  out = http::context::response((context *)0x44b926);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"application/json",&local_39);
  http::response::set_content_header(in_stack_00000090,in_stack_00000088);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  http::context::response((context *)0x44b981);
  poVar1 = http::response::out(in_stack_00000108);
  std::operator<<(poVar1,"{\"id\":");
  poVar1 = json::operator<<((ostream *)out,in_RDI);
  std::operator<<(poVar1,",\"error\":null,\"result\":");
  poVar1 = json::operator<<((ostream *)out,in_RDI);
  std::operator<<(poVar1,"}");
  return;
}

Assistant:

void json_call::return_result(http::context &c,json::value const &result)
	{
		c.response().set_content_header("application/json");
		c.response().out() <<
			"{\"id\":"<<id_<<",\"error\":null,\"result\":"<<result<<"}";
	}